

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball.cpp
# Opt level: O3

vec3 __thiscall lumeview::ArcBall::get_ball_point_from_frame_coords(ArcBall *this,vec2 *c)

{
  anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0 aVar1
  ;
  float fVar2;
  float fVar3;
  float fVar7;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vec3 vVar8;
  
  aVar1 = (this->m_frame).field_0.field_0;
  fVar3 = aVar1.x;
  fVar2 = aVar1.y;
  aVar1 = (this->m_offset).field_0.field_0;
  auVar5._0_4_ = ((c->field_0).field_0.x - aVar1.x) - fVar3 * 0.5;
  auVar5._4_4_ = ((c->field_0).field_0.y - aVar1.y) - fVar2 * 0.5;
  auVar5._8_8_ = 0;
  auVar6._4_4_ = fVar2 * this->m_radius * 0.5;
  auVar6._0_4_ = this->m_radius * fVar3 * 0.5;
  auVar6._8_8_ = 0;
  auVar6 = divps(auVar5,auVar6);
  uVar4 = auVar6._0_8_;
  fVar2 = auVar6._0_4_;
  fVar7 = auVar6._4_4_;
  fVar3 = fVar2 * fVar2 + fVar7 * fVar7;
  if (fVar3 <= 1.0) {
    fVar3 = 1.0 - fVar3;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
  }
  else {
    uVar4 = CONCAT44(fVar7 * (1.0 / SQRT(fVar3)),fVar2 * (1.0 / SQRT(fVar3)));
    fVar3 = 0.0;
  }
  vVar8.field_0.field_0.z = fVar3;
  vVar8.field_0._0_8_ = uVar4;
  return (vec3)vVar8.field_0;
}

Assistant:

glm::vec3 ArcBall::get_ball_point_from_frame_coords(const glm::vec2& c) const
{
    vec3 p;
    p.x   = (c.x - m_offset.x - m_frame.x / 2.f) / (m_radius * m_frame.x / 2.f);
    p.y   = (c.y - m_offset.y - m_frame.y / 2.f) / (m_radius * m_frame.y / 2.f);
    p.z   = 0.0f;

    const float mag = p.x * p.x + p.y * p.y;

    if (mag > 1.0f) {
        float scale = 1.0f / sqrtf (mag);
        p.x *= scale;
        p.y *= scale;
    }
    else
        p.z = sqrtf (1.0f - mag);

    return p;
}